

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O3

void ed_add(ed *out,ed *P,ed *Q)

{
  int i;
  long lVar1;
  fld_t t;
  fld_t d;
  fld_t b;
  fld_t a;
  fld_t c;
  fld_t h;
  fld_t g;
  fld_t f;
  fld_t e;
  limb_t local_1d8 [6];
  limb_t local_1a8 [6];
  limb_t local_178 [6];
  limb_t local_148 [6];
  limb_t local_118 [6];
  limb_t local_e8 [6];
  limb_t local_b8 [6];
  limb_t local_88 [6];
  limb_t local_58 [6];
  
  lVar1 = 0;
  do {
    local_148[lVar1] = P->y[lVar1] - P->x[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_1d8[lVar1] = Q->y[lVar1] - Q->x[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  fld_mul(local_148,local_148,local_1d8);
  lVar1 = 0;
  do {
    local_178[lVar1] = P->x[lVar1] + P->y[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_1d8[lVar1] = Q->x[lVar1] + Q->y[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  fld_mul(local_178,local_178,local_1d8);
  fld_mul(local_118,P->t,Q->t);
  fld_mul(local_118,local_118,con_2d);
  fld_mul(local_1a8,P->z,Q->z);
  lVar1 = 0;
  do {
    local_1a8[lVar1] = local_1a8[lVar1] << 1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_58[lVar1] = local_178[lVar1] - local_148[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_88[lVar1] = local_1a8[lVar1] - local_118[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_b8[lVar1] = local_118[lVar1] + local_1a8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_e8[lVar1] = local_148[lVar1] + local_178[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  fld_mul(out->x,local_58,local_88);
  fld_mul(out->y,local_b8,local_e8);
  fld_mul(out->t,local_58,local_e8);
  fld_mul(out->z,local_88,local_b8);
  return;
}

Assistant:

static void
ed_add(struct ed *out, const struct ed *P, const struct ed *Q)
{
	fld_t a, b, c, d, e, f, g, h, t;
	
	fld_sub(a, P->y, P->x);
	fld_sub(t, Q->y, Q->x);
	fld_mul(a, a, t);

	fld_add(b, P->y, P->x);
	fld_add(t, Q->y, Q->x);
	fld_mul(b, b, t);

	fld_mul(c, P->t, Q->t);
	fld_mul(c, c, con_2d);

	fld_mul(d, P->z, Q->z);
	fld_scale2(d, d);

	fld_sub(e, b, a);
	fld_sub(f, d, c);
	fld_add(g, d, c);
	fld_add(h, b, a);
	
	fld_mul(out->x, e, f);
	fld_mul(out->y, g, h);
	fld_mul(out->t, e, h);
	fld_mul(out->z, f, g);
}